

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access-control.c
# Opt level: O1

int ndn_ac_trigger_expiration(uint8_t service,uint32_t received_keyid)

{
  int iVar1;
  ndn_aes_key_t *pnVar2;
  ndn_key_storage_t *component;
  bool bVar3;
  undefined1 local_588 [8];
  ndn_interest_t interest;
  uint8_t ac;
  uint8_t service_local;
  
  interest.signature.is_interest = (_Bool)service;
  pnVar2 = ndn_ac_get_key_for_service(service);
  if (pnVar2->key_id < received_keyid) {
    printf("DEBUG: %s, L%d: ","ndn_ac_trigger_expiration",0x246);
    printf("[ACCESSCTL] Local Decryption Key %u forced expired\n",(ulong)pnVar2->key_id);
    _express_dkey_interest(interest.signature.is_interest);
  }
  else {
    bVar3 = false;
    printf("DEBUG: %s, L%d: ","ndn_ac_trigger_expiration",0x24a);
    printf("[ACCESSCTL] Notifying Encryption Key %u forced expired\n",received_keyid);
    ndn_name_init((ndn_name_t *)local_588);
    interest.lifetime._0_1_ = 0;
    interest.name.components[9].size = '\0';
    interest.name.components[9]._41_3_ = 0;
    interest.name.components_size = 0xa0;
    interest.name._441_3_ = 0xf;
    interest.nonce = 0;
    interest.parameters.value[0xf4] = '\0';
    component = ndn_key_storage_get_instance();
    iVar1 = ndn_name_append_component((ndn_name_t *)local_588,(name_component_t *)component);
    if (iVar1 == 0) {
      interest.signature.enable_ValidityPeriod = '\x03';
      iVar1 = ndn_name_append_bytes_component
                        ((ndn_name_t *)local_588,&interest.signature.enable_ValidityPeriod,1);
      if ((((iVar1 == 0) &&
           (iVar1 = ndn_name_append_string_component((ndn_name_t *)local_588,"NOTIFY",6), iVar1 == 0
           )) && (iVar1 = ndn_name_append_bytes_component
                                    ((ndn_name_t *)local_588,&interest.signature.is_interest,1),
                 iVar1 == 0)) &&
         (iVar1 = ndn_name_append_keyid((ndn_name_t *)local_588,received_keyid), iVar1 == 0)) {
        iVar1 = ndn_forwarder_express_interest_struct
                          ((ndn_interest_t *)local_588,(ndn_on_data_func)0x0,
                           (ndn_on_timeout_func)0x0,(void *)0x0);
        bVar3 = iVar1 == 0;
      }
      else {
        bVar3 = false;
      }
    }
    if (!bVar3) {
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int
ndn_ac_trigger_expiration(uint8_t service, uint32_t received_keyid)
{
  int ret = -1;
  // check if it's a local key
  ndn_aes_key_t* aes_key = ndn_ac_get_key_for_service(service);
  if (aes_key->key_id < received_keyid) {
    NDN_LOG_DEBUG("[ACCESSCTL] Local Decryption Key %" PRIu32 " forced expired\n", aes_key->key_id);
    _express_dkey_interest(service);
  }
  else {
    NDN_LOG_DEBUG("[ACCESSCTL] Notifying Encryption Key %" PRIu32 " forced expired\n", received_keyid);
    ndn_interest_t interest;
    ndn_interest_init(&interest);
    ndn_key_storage_t* storage = ndn_key_storage_get_instance();
    ret = ndn_name_append_component(&interest.name, &storage->self_identity[0].components[0]);
    if (ret != 0) return ret;
    uint8_t ac = NDN_SD_AC;
    ret = ndn_name_append_bytes_component(&interest.name, &ac, 1);
    if (ret != 0) return ret;
    ret = ndn_name_append_string_component(&interest.name, "NOTIFY", strlen("NOTIFY"));
    if (ret != 0) return ret;
    ret = ndn_name_append_bytes_component(&interest.name, &service, 1);
    if (ret != 0) return ret;
    ret = ndn_name_append_keyid(&interest.name, received_keyid);
    if (ret != 0) return ret;
    ret = ndn_forwarder_express_interest_struct(&interest, NULL, NULL, NULL);
    if (ret != 0) return ret;
  }

  return NDN_SUCCESS;
}